

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature_algorithm_unittest.cc
# Opt level: O1

void __thiscall
bssl::anon_unknown_0::SignatureAlgorithmTest_ParseDerRsaPssNonDefaultHashAndMaskGenAndSalt_Test::
TestBody(SignatureAlgorithmTest_ParseDerRsaPssNonDefaultHashAndMaskGenAndSalt_Test *this)

{
  optional<bssl::SignatureAlgorithm> oVar1;
  long lVar2;
  pointer *__ptr_2;
  pointer *__ptr;
  undefined8 *puVar3;
  uchar *puVar4;
  char *in_R9;
  Input algorithm_identifier;
  AssertionResult gtest_ar_;
  uint8_t kData [67];
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_98;
  AssertHelper local_90;
  internal local_88 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  string local_78;
  uchar local_58 [64];
  undefined2 local_18;
  undefined1 local_16;
  
  puVar3 = &DAT_005859b0;
  puVar4 = local_58;
  for (lVar2 = 8; lVar2 != 0; lVar2 = lVar2 + -1) {
    *(undefined8 *)puVar4 = *puVar3;
    puVar3 = puVar3 + 1;
    puVar4 = puVar4 + 8;
  }
  local_16 = 10;
  local_18 = 0x102;
  algorithm_identifier.data_.size_ = 0x43;
  algorithm_identifier.data_.data_ = local_58;
  oVar1 = ParseSignatureAlgorithm(algorithm_identifier);
  local_88[0] = (internal)
                (((ulong)oVar1.super__Optional_base<bssl::SignatureAlgorithm,_true,_true>._M_payload
                         .super__Optional_payload_base<bssl::SignatureAlgorithm> >> 0x20 & 1) == 0);
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_88[0]) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_78,local_88,(AssertionResult *)"ParseSignatureAlgorithm(der::Input(kData))",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/signature_algorithm_unittest.cc"
               ,0x357,local_78._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if (local_98._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_98._M_head_impl + 8))();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    ::std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  return;
}

Assistant:

TEST(SignatureAlgorithmTest, ParseDerRsaPssNonDefaultHashAndMaskGenAndSalt) {
  // clang-format off
  const uint8_t kData[] = {
      0x30, 0x41,  // SEQUENCE (65 bytes)
      0x06, 0x09,  // OBJECT IDENTIFIER (9 bytes)
      0x2A, 0x86, 0x48, 0x86, 0xF7, 0x0D, 0x01, 0x01, 0x0A,
      0x30, 0x34,  // SEQUENCE (52 bytes)
      0xA0, 0x0F,  // [0] (15 bytes)
      0x30, 0x0D,  // SEQUENCE (13 bytes)
      0x06, 0x09,  // OBJECT IDENTIFIER (9 bytes)
      0x60, 0x86, 0x48, 0x01, 0x65, 0x03, 0x04, 0x02, 0x01,
      0x05, 0x00,  // NULL (0 bytes)
      0xA1, 0x1C,  // [1] (28 bytes)
      0x30, 0x1A,  // SEQUENCE (26 bytes)
      0x06, 0x09,  // OBJECT IDENTIFIER (9 bytes)
      0x2A, 0x86, 0x48, 0x86, 0xF7, 0x0D, 0x01, 0x01, 0x08,
      0x30, 0x0D,  // SEQUENCE (13 bytes)
      0x06, 0x09,  // OBJECT IDENTIFIER (9 bytes)
      0x60, 0x86, 0x48, 0x01, 0x65, 0x03, 0x04, 0x02, 0x01,
      0x05, 0x00,  // NULL (0 bytes)
      0xA2, 0x03,  // [2] (3 bytes)
      0x02, 0x01,  // INTEGER (1 byte)
      0x0A,
  };
  // clang-format on
  EXPECT_FALSE(ParseSignatureAlgorithm(der::Input(kData)));
}